

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertConditionalConLHS<mp::QuadAndLinTerms,mp::AlgConRhs<2>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                 *con,int i)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  bool bVar1;
  int iVar2;
  ConType *pCVar3;
  FunctionalConstraint *in_RSI;
  long in_RDI;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_> ccnew;
  LinTerms lt;
  Var resvar;
  QuadraticFunctionalConstraint fc;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  alscope;
  QuadraticExpr *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  QuadAndLinTerms *in_stack_fffffffffffff738;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_stack_fffffffffffff740;
  int var;
  undefined8 in_stack_fffffffffffff748;
  undefined1 fSort;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  QuadraticFunctionalConstraint *in_stack_fffffffffffff750;
  Context ctx;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff758;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *this_01;
  AlgConRhs<2> rr;
  iterator pdVar4;
  undefined1 *puVar5;
  undefined4 in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff79c;
  LinTerms *in_stack_fffffffffffff7a0;
  Arguments *in_stack_fffffffffffff7c8;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>
  *in_stack_fffffffffffff7d0;
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff820;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>
  *in_stack_fffffffffffff870;
  int in_stack_fffffffffffff87c;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff880;
  undefined1 local_740 [212];
  Var local_66c;
  _Bit_pointer local_668;
  _Bit_type *local_660;
  undefined1 local_639 [169];
  Var local_590;
  undefined1 local_580 [440];
  double local_3c8 [119];
  FunctionalConstraint *local_10;
  
  local_10 = in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  MakeAutoLinker<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>>
            (in_stack_fffffffffffff758,
             (ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
              *)in_stack_fffffffffffff750,(int)((ulong)in_stack_fffffffffffff748 >> 0x20));
  fSort = (undefined1)((ulong)in_stack_fffffffffffff748 >> 0x38);
  pCVar3 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>::
           GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                          *)0x528fbb);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::GetArguments
            ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_> *)0x528fcc);
  QuadAndLinTerms::QuadAndLinTerms
            (&in_stack_fffffffffffff740->super_QuadAndLinTerms,in_stack_fffffffffffff738);
  pdVar4 = local_3c8;
  puVar5 = local_580;
  AlgebraicExpression<mp::QuadAndLinTerms>::AlgebraicExpression
            (in_stack_fffffffffffff740,in_stack_fffffffffffff738,
             (double)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  MakeFunctionalConstraint(in_stack_fffffffffffff728);
  AlgebraicExpression<mp::QuadAndLinTerms>::~AlgebraicExpression
            ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x529021);
  QuadAndLinTerms::~QuadAndLinTerms
            ((QuadAndLinTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  local_590 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResultVar2Args<mp::QuadraticFunctionalConstraint>
                        (in_stack_fffffffffffff758,in_stack_fffffffffffff750);
  bVar1 = FlatModel<mp::DefaultFlatModelParams>::VarHasMarking
                    ((FlatModel<mp::DefaultFlatModelParams> *)
                     CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                     (int)((ulong)in_stack_fffffffffffff728 >> 0x20));
  if (!bVar1) {
    FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression
              ((FlatModel<mp::DefaultFlatModelParams> *)
               CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
               (int)((ulong)in_stack_fffffffffffff728 >> 0x20));
  }
  local_639._1_8_ = (pointer)0x3ff0000000000000;
  local_639._9_8_ = local_639 + 1;
  local_639._17_8_ = (pointer)0x1;
  rr.rhs_ = (double)local_639;
  std::allocator<double>::allocator((allocator<double> *)0x5290fc);
  __l._M_len = (size_type)puVar5;
  __l._M_array = pdVar4;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)rr.rhs_,__l,
             (allocator_type *)in_stack_fffffffffffff758);
  local_66c = local_590;
  local_668 = (_Bit_pointer)&local_66c;
  local_660 = (_Bit_type *)0x1;
  this_01 = (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *)(local_740 + 0xd3);
  std::allocator<int>::allocator((allocator<int> *)0x52915c);
  __l_00._M_len = (size_type)puVar5;
  __l_00._M_array = (iterator)pdVar4;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_00,(allocator_type *)this_01);
  LinTerms::LinTerms(in_stack_fffffffffffff7a0,
                     (vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_fffffffffffff79c,in_stack_fffffffffffff798),
                     (vector<int,_std::allocator<int>_> *)pCVar3);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff740);
  std::allocator<int>::~allocator((allocator<int> *)0x5291b9);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff740);
  std::allocator<double>::~allocator((allocator<double> *)0x5291d3);
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                     (LinTerms *)in_stack_fffffffffffff728);
  pCVar3 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>::
           GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                          *)0x5291f5);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>::GetRhsOrRange(pCVar3);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>::AlgebraicConstraint
            (this_01,(LinTerms *)pCVar3,rr,(bool)fSort);
  ctx.value_ = (CtxVal)((ulong)pCVar3 >> 0x20);
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             *)local_740;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>::
  ConditionalConstraint(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_> *)
             CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  LinTerms::~LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730));
  var = (int)((ulong)(in_RDI + -0x208) >> 0x20);
  FunctionalConstraint::GetResultVar(local_10);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  RedefineVariable<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<2>>>>
            (in_stack_fffffffffffff880,in_stack_fffffffffffff87c,in_stack_fffffffffffff870);
  iVar2 = FunctionalConstraint::GetResultVar(local_10);
  FunctionalConstraint::GetContext(local_10);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr(this_00,var,ctx);
  ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_>::
  ~ConditionalConstraint
            ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<2>_>_> *)
             0x5292e5);
  LinTerms::~LinTerms((LinTerms *)CONCAT44(iVar2,in_stack_fffffffffffff730));
  QuadraticFunctionalConstraint::~QuadraticFunctionalConstraint
            ((QuadraticFunctionalConstraint *)CONCAT44(iVar2,in_stack_fffffffffffff730));
  pre::
  AutoLinkScope<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::~AutoLinkScope(in_stack_fffffffffffff820);
  return;
}

Assistant:

void ConvertConditionalConLHS(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i) {
    auto alscope = MPD( MakeAutoLinker( con, i ) );       // link from \a con
    /// Create a functional constraint from the LHS
    auto fc = MakeFunctionalConstraint(
        AlgebraicExpression{con.GetConstraint().GetArguments(), 0.0});
    auto resvar = MPD( AssignResultVar2Args(std::move(fc)) );
    if ( !MPCD(VarHasMarking(resvar) ))         // mark as expr if new
      MPD( MarkAsExpression(resvar) );
    /// resvar can be a proper variable - ModelAPI should flexibly handle this
    LinTerms lt { {1.0}, {resvar} };
    ConditionalConstraint< AlgebraicConstraint<LinTerms, RhsOrRange> >
        ccnew { { std::move(lt), con.GetConstraint().GetRhsOrRange() } };
    MPD( RedefineVariable(con.GetResultVar(), std::move(ccnew)) );  // Use new CondCon
    MPD( PropagateResultOfInitExpr(con.GetResultVar(), con.GetContext()) ); // context
  }